

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

int Nwk_ObjMffcLabel(Nwk_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Nwk_ObjDeref_rec(pNode);
  Nwk_ManIncrementTravId(pNode->pMan);
  Nwk_ObjMffcLabel_rec(pNode,1);
  iVar2 = Nwk_ObjRef_rec(pNode);
  if (iVar1 == iVar2) {
    return iVar1;
  }
  __assert_fail("Count1 == Count2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkDfs.c"
                ,0x28e,"int Nwk_ObjMffcLabel(Nwk_Obj_t *)");
}

Assistant:

int Nwk_ObjMffcLabel( Nwk_Obj_t * pNode )
{
    int Count1, Count2;
    // dereference the node
    Count1 = Nwk_ObjDeref_rec( pNode );
    // collect the nodes inside the MFFC
    Nwk_ManIncrementTravId( pNode->pMan );
    Nwk_ObjMffcLabel_rec( pNode, 1 );
    // reference it back
    Count2 = Nwk_ObjRef_rec( pNode );
    assert( Count1 == Count2 );
    return Count1;
}